

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int LTnum(TValue *l,TValue *r)

{
  double dVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  lua_Number lVar7;
  long local_18;
  
  if (l->tt_ == '\x03') {
    lVar2 = (l->value_).i;
    if (r->tt_ == '\x03') {
      bVar5 = lVar2 < (r->value_).i;
      goto LAB_00112e3a;
    }
    dVar1 = (r->value_).n;
    if (0x40000000000000 < lVar2 + 0x20000000000000U) {
      iVar3 = luaV_flttointeger(dVar1,&local_18,F2Iceil);
      bVar5 = lVar2 < local_18;
      if (iVar3 == 0) {
        bVar5 = 0.0 < dVar1;
      }
      goto LAB_00112e3a;
    }
    bVar5 = dVar1 == (double)lVar2;
    bVar4 = dVar1 < (double)lVar2;
  }
  else {
    dVar1 = (l->value_).n;
    if (r->tt_ == '\x13') {
      lVar7 = (r->value_).n;
    }
    else {
      lVar2 = (r->value_).i;
      if (0x40000000000000 < lVar2 + 0x20000000000000U) {
        dVar6 = floor(dVar1);
        bVar5 = (long)dVar6 < lVar2;
        if (9.223372036854776e+18 <= dVar6) {
          bVar5 = dVar1 < 0.0;
        }
        if (dVar6 < -9.223372036854776e+18) {
          bVar5 = dVar1 < 0.0;
        }
        goto LAB_00112e3a;
      }
      lVar7 = (lua_Number)lVar2;
    }
    bVar5 = lVar7 == dVar1;
    bVar4 = lVar7 < dVar1;
  }
  bVar5 = !bVar4 && !bVar5;
LAB_00112e3a:
  return (int)bVar5;
}

Assistant:

l_sinline int LTnum (const TValue *l, const TValue *r) {
  lua_assert(ttisnumber(l) && ttisnumber(r));
  if (ttisinteger(l)) {
    lua_Integer li = ivalue(l);
    if (ttisinteger(r))
      return li < ivalue(r);  /* both are integers */
    else  /* 'l' is int and 'r' is float */
      return LTintfloat(li, fltvalue(r));  /* l < r ? */
  }
  else {
    lua_Number lf = fltvalue(l);  /* 'l' must be float */
    if (ttisfloat(r))
      return luai_numlt(lf, fltvalue(r));  /* both are float */
    else  /* 'l' is float and 'r' is int */
      return LTfloatint(lf, ivalue(r));
  }
}